

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O3

bool __thiscall ConditionalExecution::testOpRead(ConditionalExecution *this,Varnode *vn,PcodeOp *op)

{
  pointer ppVVar1;
  Varnode *pVVar2;
  PcodeOp *pPVar3;
  bool bVar4;
  PcodeOp *local_10;
  
  bVar4 = true;
  if (op->parent != this->iblock) {
    if (((((op->opcode->opcode == CPUI_RETURN) && (this->directsplit == false)) &&
         (ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
         1 < (int)((ulong)((long)(op->inrefs).
                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3))) &&
        ((ppVVar1[1] == vn && (vn->def->opcode->opcode == CPUI_COPY)))) &&
       ((pVVar2 = *(vn->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start, (pVVar2->flags & 0x10) != 0 &&
        ((pPVar3 = pVVar2->def, pPVar3->parent != this->iblock ||
         (pPVar3->opcode->opcode == CPUI_MULTIEQUAL)))))) {
      local_10 = op;
      std::vector<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(&this->returnop,&local_10);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ConditionalExecution::testOpRead(Varnode *vn,PcodeOp *op)

{
  if (op->getParent() == iblock) return true;
  if ((op->code() == CPUI_RETURN)&&(!directsplit)) {
    if ((op->numInput() < 2)||(op->getIn(1) != vn)) return false; // Only test for flow thru to return value
    PcodeOp *copyop = vn->getDef();
    if (copyop->code() == CPUI_COPY) {
      // Ordinarily, if -vn- is produced by a COPY we want to return false here because the propagation
      // hasn't had time to happen here.  But if the flow is into a RETURN this can't propagate, so
      // we allow this as a read that can be altered.  (We have to move the COPY)
      Varnode *invn = copyop->getIn(0);
      if (!invn->isWritten()) return false;
      PcodeOp *upop = invn->getDef();
      if ((upop->getParent() == iblock)&&(upop->code() != CPUI_MULTIEQUAL))
	return false;
      returnop.push_back(op);
      return true;
    }
  }
  return false;
}